

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  value_type vVar10;
  
  pFVar3 = (fadexpr->fadexpr_).right_;
  uVar1 = (((((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar8 = (((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar8 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if ((int)uVar8 < (int)uVar1) {
    uVar8 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar8 != uVar1) {
    if (uVar8 == 0) {
      if (uVar1 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar8;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (int)uVar8) {
        uVar9 = (long)(int)uVar8 << 3;
      }
      pdVar7 = (double *)operator_new__(uVar9);
      (this->dx_).ptr_to_data = pdVar7;
    }
  }
  if (uVar8 != 0) {
    pdVar7 = (this->dx_).ptr_to_data;
    if ((((((((((fadexpr->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0
         ) || (pFVar3 = (fadexpr->fadexpr_).right_, (((pFVar3->fadexpr_).left_)->dx_).num_elts == 0)
        ) || ((((((pFVar3->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar8) {
        uVar9 = 0;
        do {
          vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar9);
          pdVar7[uVar9] = vVar10;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
    }
    else if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
                 ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar9);
        pdVar7[uVar9] = vVar10;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar6 = (pFVar3->fadexpr_).right_;
  this->val_ = (((pFVar3->fadexpr_).left_)->val_ -
               (pFVar6->fadexpr_).left_.constant_ * ((pFVar6->fadexpr_).right_)->val_) *
               ((pFVar5->fadexpr_).left_.constant_ + ((pFVar5->fadexpr_).right_)->val_) *
               (pFVar4->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}